

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

void __thiscall cali::Log::perror(Log *this,char *__s)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  char *__s_00;
  char *in_RDX;
  char buf [120];
  char acStack_98 [128];
  
  if (LogImpl::s_instance == (LogImpl *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = LogImpl::s_instance->m_verbosity;
  }
  if (this->m_level <= iVar1) {
    poVar2 = get_stream(this);
    if (in_RDX == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(in_RDX);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,in_RDX,sVar3);
    }
    __s_00 = strerror_r((int)__s,acStack_98,0x78);
    if (__s_00 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(__s_00);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s_00,sVar3);
    }
  }
  return;
}

Assistant:

std::ostream& Log::perror(int errnum, const char* msg)
{
    if (verbosity() < m_level)
        return m_nullstream;

#ifdef _GLIBCXX_HAVE_STRERROR_R
    char buf[120];
    return get_stream() << msg << strerror_r(errnum, buf, sizeof(buf));
#else
    return get_stream() << msg << strerror(errnum);
#endif
}